

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O2

JoinRelationSet * __thiscall
duckdb::CardinalityEstimator::UpdateNumeratorRelations
          (CardinalityEstimator *this,Subgraph2Denominator left,Subgraph2Denominator right,
          FilterInfoWithTotalDomains *filter)

{
  Subgraph2Denominator *pSVar1;
  bool bVar2;
  FilterInfo *pFVar3;
  JoinRelationSet *pJVar4;
  JoinRelationSet *pJVar5;
  
  pFVar3 = optional_ptr<duckdb::FilterInfo,_true>::operator->(&filter->filter_info);
  if (1 < (byte)(pFVar3->join_type - SEMI)) {
    pJVar4 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&left.numerator_relations);
    pJVar5 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&right.numerator_relations);
    pJVar4 = JoinRelationSetManager::Union(&this->set_manager,pJVar4,pJVar5);
    return pJVar4;
  }
  pJVar4 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&left.relations);
  pFVar3 = optional_ptr<duckdb::FilterInfo,_true>::operator->(&filter->filter_info);
  pJVar5 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar3->left_set);
  bVar2 = JoinRelationSet::IsSubset(pJVar4,pJVar5);
  if (bVar2) {
    pJVar4 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&right.relations);
    pFVar3 = optional_ptr<duckdb::FilterInfo,_true>::operator->(&filter->filter_info);
    pJVar5 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar3->right_set);
    bVar2 = JoinRelationSet::IsSubset(pJVar4,pJVar5);
    if (bVar2) {
      pSVar1 = &left;
      goto LAB_01a5e060;
    }
  }
  pSVar1 = &right;
LAB_01a5e060:
  pJVar4 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pSVar1->numerator_relations);
  return pJVar4;
}

Assistant:

JoinRelationSet &CardinalityEstimator::UpdateNumeratorRelations(Subgraph2Denominator left, Subgraph2Denominator right,
                                                                FilterInfoWithTotalDomains &filter) {
	switch (filter.filter_info->join_type) {
	case JoinType::SEMI:
	case JoinType::ANTI: {
		if (JoinRelationSet::IsSubset(*left.relations, *filter.filter_info->left_set) &&
		    JoinRelationSet::IsSubset(*right.relations, *filter.filter_info->right_set)) {
			return *left.numerator_relations;
		}
		return *right.numerator_relations;
	}
	default:
		// cross product or inner join
		return set_manager.Union(*left.numerator_relations, *right.numerator_relations);
	}
}